

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl-ssl.c
# Opt level: O1

int lws_context_init_ssl_pem_passwd_client_cb(char *buf,int size,int rwflag,void *userdata)

{
  char *__src;
  size_t sVar1;
  
  __src = *(char **)((long)userdata + 0x118);
  if (__src == (char *)0x0) {
    __src = *(char **)((long)userdata + 0x28);
  }
  strncpy(buf,__src,(long)size);
  buf[(long)size - 1] = '\0';
  sVar1 = strlen(buf);
  return (int)sVar1;
}

Assistant:

static int
lws_context_init_ssl_pem_passwd_client_cb(char *buf, int size, int rwflag,
					  void *userdata)
{
	struct lws_context_creation_info * info =
			(struct lws_context_creation_info *)userdata;
	const char *p = info->ssl_private_key_password;

	if (info->client_ssl_private_key_password)
		p = info->client_ssl_private_key_password;

	strncpy(buf, p, size);
	buf[size - 1] = '\0';

	return (int)strlen(buf);
}